

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_scandir_empty_dir(void)

{
  void **__s;
  ssize_t sVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int iVar4;
  int extraout_EAX_00;
  uv_loop_t *puVar5;
  undefined8 uVar6;
  ulong *extraout_RAX;
  ulong *puVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  void *pvVar10;
  long extraout_RAX_00;
  void *pvVar11;
  char *pcVar12;
  uv_fs_t *puVar13;
  ulong unaff_RBP;
  ulong *puVar14;
  char *unaff_R12;
  long lVar15;
  char *pcVar16;
  long unaff_R13;
  uv_fs_t *puVar17;
  uv_fs_t *puVar18;
  uv_fs_t *unaff_R15;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  uv_buf_t uVar22;
  undefined1 auVar23 [16];
  int64_t eval_b;
  int64_t eval_b_2;
  uv_dirent_t dent;
  uv_fs_t req;
  undefined1 auStack_e0a [2];
  code *pcStack_e08;
  undefined8 uStack_e00;
  long lStack_df8;
  long lStack_df0;
  long lStack_de8;
  ulong uStack_de0;
  void *pvStack_dd8;
  uv_fs_t *puStack_dd0;
  long lStack_dc8;
  uv_fs_t *puStack_dc0;
  uv_fs_t *puStack_db8;
  code *pcStack_db0;
  long lStack_da8;
  long lStack_da0;
  code *pcStack_d98;
  undefined8 uStack_d90;
  ssize_t sStack_d80;
  ssize_t sStack_d78;
  void *pvStack_d70;
  uv_fs_t *puStack_d68;
  ssize_t asStack_d20 [2];
  undefined1 auStack_d10 [16];
  undefined1 auStack_d00 [24];
  void *pvStack_ce8;
  char *pcStack_c98;
  uint64_t uStack_c90;
  uv_fs_t *puStack_c88;
  uv_fs_t *puStack_c80;
  uint64_t uStack_c78;
  uint64_t uStack_c70;
  code *pcStack_c68;
  uint64_t uStack_c60;
  char *pcStack_c50;
  char *pcStack_c48;
  undefined1 auStack_c40 [16];
  undefined1 auStack_c30 [16];
  undefined1 auStack_c20 [16];
  undefined1 auStack_c10 [16];
  char *apcStack_c00 [32];
  undefined1 auStack_b00 [256];
  undefined1 auStack_a00 [128];
  undefined1 auStack_980 [128];
  uint64_t uStack_900;
  uv_fs_t *puStack_8f8;
  long lStack_8c0;
  char *pcStack_8b8;
  uv_fs_t *puStack_8b0;
  undefined8 uStack_8a8;
  ssize_t sStack_898;
  ssize_t sStack_890;
  undefined8 uStack_888;
  uv_fs_t *puStack_880;
  ulong uStack_830;
  uv_fs_t uStack_828;
  uv_loop_t *puStack_668;
  uv_fs_t *puStack_660;
  long lStack_658;
  long lStack_650;
  long alStack_648 [2];
  undefined1 auStack_638 [488];
  undefined1 auStack_450 [72];
  uv__queue *puStack_408;
  uv__queue *apuStack_400 [2];
  uv_fs_t uStack_3f0;
  uv_loop_t *puStack_230;
  void **ppvStack_228;
  code *pcStack_218;
  ssize_t asStack_210 [2];
  code *pcStack_200;
  uv_fs_t local_1f0;
  
  pcStack_200 = (code *)0x196526;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = "./empty_dir/";
  __s = local_1f0.reserved + 1;
  pcStack_200 = (code *)0x19654e;
  uv_fs_mkdir(0,__s,"./empty_dir/",0x1ff,0);
  pcStack_200 = (code *)0x196556;
  uv_fs_req_cleanup(__s);
  pcStack_200 = (code *)0x196568;
  memset(__s,0xdb,0x1c0);
  pcStack_200 = (code *)0x19657a;
  iVar2 = uv_fs_scandir(0,__s,"./empty_dir/",0,0);
  local_1f0._16_8_ = SEXT48(iVar2);
  local_1f0.data = (uv_loop_t *)0x0;
  if (local_1f0._16_8_ == 0) {
    local_1f0._16_8_ = local_1f0.statbuf.st_mode;
    local_1f0.data = (uv_loop_t *)0x0;
    if (local_1f0.statbuf.st_mode != 0) goto LAB_00196730;
    if (local_1f0.statbuf.st_nlink != 0) goto LAB_0019673f;
    local_1f0.data = (uv_loop_t *)0xfffffffffffff001;
    pcStack_200 = (code *)0x1965e9;
    iVar2 = uv_fs_scandir_next(local_1f0.reserved + 1,&local_1f0.type);
    local_1f0.loop = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)local_1f0.data != local_1f0.loop) goto LAB_00196744;
    pcStack_200 = (code *)0x19660a;
    uv_fs_req_cleanup(local_1f0.reserved + 1);
    pcStack_200 = (code *)0x19662d;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
    local_1f0.data = (void *)(long)iVar2;
    local_1f0.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_1f0.data != (uv_loop_t *)0x0) goto LAB_00196753;
    local_1f0.data = (void *)(long)scandir_cb_count;
    local_1f0.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_1f0.data != (uv_loop_t *)0x0) goto LAB_00196762;
    pcStack_200 = (code *)0x196680;
    uv_run(loop,0);
    local_1f0.data = (uv_loop_t *)0x1;
    local_1f0.loop = (uv_loop_t *)(long)scandir_cb_count;
    if (local_1f0.loop != (uv_loop_t *)0x1) goto LAB_00196771;
    pcStack_200 = (code *)0x1966bd;
    uv_fs_rmdir(0,local_1f0.reserved + 1,"./empty_dir/",0);
    pcStack_200 = (code *)0x1966c5;
    uv_fs_req_cleanup(local_1f0.reserved + 1);
    pcVar12 = (char *)loop;
    pcStack_200 = (code *)0x1966dd;
    uv_walk(loop,close_walk_cb,0);
    pcStack_200 = (code *)0x1966e7;
    uv_run(pcVar12,0);
    local_1f0.data = (uv_loop_t *)0x0;
    pcStack_200 = (code *)0x1966fc;
    iVar2 = uv_loop_close(loop);
    local_1f0.loop = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)local_1f0.data == local_1f0.loop) {
      pcStack_200 = (code *)0x196714;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_200 = (code *)0x196730;
    run_test_fs_scandir_empty_dir_cold_1();
LAB_00196730:
    pcStack_200 = (code *)0x19673f;
    run_test_fs_scandir_empty_dir_cold_2();
LAB_0019673f:
    pcStack_200 = (code *)0x196744;
    run_test_fs_scandir_empty_dir_cold_3();
LAB_00196744:
    pcStack_200 = (code *)0x196753;
    run_test_fs_scandir_empty_dir_cold_4();
LAB_00196753:
    pcStack_200 = (code *)0x196762;
    run_test_fs_scandir_empty_dir_cold_5();
LAB_00196762:
    pcStack_200 = (code *)0x196771;
    run_test_fs_scandir_empty_dir_cold_6();
LAB_00196771:
    pcStack_200 = (code *)0x196780;
    run_test_fs_scandir_empty_dir_cold_7();
  }
  puVar17 = &local_1f0;
  pcStack_200 = empty_scandir_cb;
  run_test_fs_scandir_empty_dir_cold_8();
  if (puVar17 == &scandir_req) {
    asStack_210[0] = (ssize_t)scandir_req.fs_type;
    pcStack_218 = (code *)0x16;
    if (asStack_210[0] != 0x16) goto LAB_0019683a;
    asStack_210[0] = scandir_req.result;
    pcStack_218 = (code *)0x0;
    if (scandir_req.result != 0) goto LAB_00196849;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00196858;
    pcStack_218 = (code *)0xfffffffffffff001;
    ppvStack_228 = (void **)0x19680b;
    iVar2 = uv_fs_scandir_next(&scandir_req,asStack_210);
    pcStack_200 = (code *)(long)iVar2;
    if (pcStack_218 == pcStack_200) {
      ppvStack_228 = (void **)0x19682a;
      iVar2 = uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    ppvStack_228 = (void **)0x19683a;
    empty_scandir_cb_cold_1();
LAB_0019683a:
    ppvStack_228 = (void **)0x196849;
    empty_scandir_cb_cold_2();
LAB_00196849:
    ppvStack_228 = (void **)0x196858;
    empty_scandir_cb_cold_3();
LAB_00196858:
    ppvStack_228 = (void **)0x19685d;
    empty_scandir_cb_cold_4();
  }
  ppvStack_228 = (void **)run_test_fs_scandir_non_existent_dir;
  empty_scandir_cb_cold_5();
  auStack_450._48_8_ = (void *)0x19687b;
  puStack_230 = (uv_loop_t *)pcVar12;
  ppvStack_228 = __s;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = "./non_existent_dir/";
  puVar17 = &uStack_3f0;
  auStack_450._48_8_ = (void *)0x19689d;
  uv_fs_rmdir(0,puVar17,"./non_existent_dir/",0);
  auStack_450._48_8_ = (void *)0x1968a5;
  uv_fs_req_cleanup(puVar17);
  auStack_450._48_8_ = (void *)0x1968b7;
  memset(puVar17,0xdb,0x1c0);
  auStack_450._48_8_ = (void *)0x1968c9;
  iVar2 = uv_fs_scandir(0,puVar17,"./non_existent_dir/",0,0);
  apuStack_400[0] = (uv__queue *)(long)iVar2;
  auStack_450._64_8_ = (uv__queue *)0xfffffffffffffffe;
  if (apuStack_400[0] == (uv__queue *)0xfffffffffffffffe) {
    apuStack_400[0] = (uv__queue *)uStack_3f0.result;
    auStack_450._64_8_ = (uv__queue *)0xfffffffffffffffe;
    if ((uv__queue *)uStack_3f0.result != (uv__queue *)0xfffffffffffffffe) goto LAB_00196a5f;
    if (uStack_3f0.ptr != (void *)0x0) goto LAB_00196a6e;
    auStack_450._64_8_ = (uv__queue *)0xfffffffffffffffe;
    auStack_450._48_8_ = (void *)0x196938;
    iVar2 = uv_fs_scandir_next(&uStack_3f0,apuStack_400);
    puStack_408 = (uv__queue *)(long)iVar2;
    if ((uv__queue *)auStack_450._64_8_ != puStack_408) goto LAB_00196a73;
    auStack_450._48_8_ = (void *)0x196959;
    uv_fs_req_cleanup(&uStack_3f0);
    auStack_450._48_8_ = (void *)0x19697c;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    auStack_450._64_8_ = SEXT48(iVar2);
    puStack_408 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_450._64_8_ != (uv__queue *)0x0) goto LAB_00196a82;
    auStack_450._64_8_ = SEXT48(scandir_cb_count);
    puStack_408 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_450._64_8_ != (uv__queue *)0x0) goto LAB_00196a91;
    auStack_450._48_8_ = (void *)0x1969cf;
    uv_run(loop,0);
    puVar5 = loop;
    auStack_450._64_8_ = (uv__queue *)0x1;
    puStack_408 = (uv__queue *)(long)scandir_cb_count;
    if (puStack_408 != (uv__queue *)0x1) goto LAB_00196aa0;
    auStack_450._48_8_ = (void *)0x196a0c;
    uv_walk(loop,close_walk_cb,0);
    auStack_450._48_8_ = (void *)0x196a16;
    uv_run(puVar5,0);
    auStack_450._64_8_ = (uv__queue *)0x0;
    auStack_450._48_8_ = (void *)0x196a2b;
    iVar2 = uv_loop_close(loop);
    puStack_408 = (uv__queue *)(long)iVar2;
    pcVar12 = (char *)puVar5;
    if ((uv__queue *)auStack_450._64_8_ == puStack_408) {
      auStack_450._48_8_ = (void *)0x196a43;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_450._48_8_ = (void *)0x196a5f;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_00196a5f:
    auStack_450._48_8_ = (void *)0x196a6e;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_00196a6e:
    auStack_450._48_8_ = (void *)0x196a73;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_00196a73:
    auStack_450._48_8_ = (void *)0x196a82;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_00196a82:
    auStack_450._48_8_ = (void *)0x196a91;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_00196a91:
    auStack_450._48_8_ = (void *)0x196aa0;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_00196aa0:
    auStack_450._48_8_ = (void *)0x196aaf;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  puVar13 = (uv_fs_t *)(auStack_450 + 0x40);
  auStack_450._48_8_ = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar13 == &scandir_req) {
    auStack_450._32_8_ = SEXT48(scandir_req.fs_type);
    auStack_450._24_8_ = (code *)0x16;
    if ((void *)auStack_450._32_8_ != (void *)0x16) goto LAB_00196b69;
    auStack_450._32_8_ = scandir_req.result;
    auStack_450._24_8_ = (code *)0xfffffffffffffffe;
    if (scandir_req.result != -2) goto LAB_00196b78;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00196b87;
    auStack_450._24_8_ = (code *)0xfffffffffffffffe;
    auStack_450._8_8_ = (uv_loop_t *)0x196b3a;
    iVar2 = uv_fs_scandir_next(&scandir_req,auStack_450 + 0x20);
    auStack_450._48_8_ = SEXT48(iVar2);
    if (auStack_450._24_8_ == auStack_450._48_8_) {
      auStack_450._8_8_ = (uv_loop_t *)0x196b59;
      iVar2 = uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    auStack_450._8_8_ = (uv_loop_t *)0x196b69;
    non_existent_scandir_cb_cold_1();
LAB_00196b69:
    auStack_450._8_8_ = (uv_loop_t *)0x196b78;
    non_existent_scandir_cb_cold_2();
LAB_00196b78:
    auStack_450._8_8_ = (uv_loop_t *)0x196b87;
    non_existent_scandir_cb_cold_3();
LAB_00196b87:
    auStack_450._8_8_ = (uv_loop_t *)0x196b8c;
    non_existent_scandir_cb_cold_4();
  }
  auStack_450._8_8_ = run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  auStack_638._472_8_ = (uv__queue *)0x196ba5;
  auStack_450._8_8_ = pcVar12;
  loop = (uv_loop_t *)uv_default_loop();
  auStack_638._472_8_ = (uv__queue *)0x196bc6;
  iVar2 = uv_fs_scandir(0,&scandir_req,"test/fixtures/empty_file",0,0);
  auStack_450._0_8_ = SEXT48(iVar2);
  auStack_638._480_8_ = (uv__queue *)0xffffffffffffffec;
  if ((uv__queue *)auStack_450._0_8_ == (uv__queue *)0xffffffffffffffec) {
    puVar13 = &scandir_req;
    auStack_638._472_8_ = (uv__queue *)0x196bf3;
    uv_fs_req_cleanup(&scandir_req);
    auStack_638._472_8_ = (uv__queue *)0x196c12;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    auStack_450._0_8_ = SEXT48(iVar2);
    auStack_638._480_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_450._0_8_ != (uv__queue *)0x0) goto LAB_00196ce2;
    auStack_450._0_8_ = SEXT48(scandir_cb_count);
    auStack_638._480_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_450._0_8_ != (uv__queue *)0x0) goto LAB_00196cef;
    auStack_638._472_8_ = (uv__queue *)0x196c61;
    uv_run(loop,0);
    puVar5 = loop;
    auStack_450._0_8_ = (uv__queue *)0x1;
    auStack_638._480_8_ = SEXT48(scandir_cb_count);
    if ((uv__queue *)auStack_638._480_8_ != (uv__queue *)0x1) goto LAB_00196cfc;
    auStack_638._472_8_ = (uv__queue *)0x196c98;
    uv_walk(loop,close_walk_cb,0);
    auStack_638._472_8_ = (uv__queue *)0x196ca2;
    uv_run(puVar5,0);
    auStack_450._0_8_ = (uv__queue *)0x0;
    auStack_638._472_8_ = (uv__queue *)0x196cb7;
    iVar2 = uv_loop_close(loop);
    auStack_638._480_8_ = SEXT48(iVar2);
    if (auStack_450._0_8_ == auStack_638._480_8_) {
      auStack_638._472_8_ = (uv__queue *)0x196ccd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_638._472_8_ = (uv__queue *)0x196ce2;
    run_test_fs_scandir_file_cold_1();
    puVar13 = (uv_fs_t *)pcVar12;
LAB_00196ce2:
    auStack_638._472_8_ = (uv__queue *)0x196cef;
    run_test_fs_scandir_file_cold_2();
LAB_00196cef:
    auStack_638._472_8_ = (uv__queue *)0x196cfc;
    run_test_fs_scandir_file_cold_3();
LAB_00196cfc:
    puVar5 = (uv_loop_t *)puVar13;
    auStack_638._472_8_ = (uv__queue *)0x196d09;
    run_test_fs_scandir_file_cold_4();
  }
  puVar13 = (uv_fs_t *)auStack_450;
  auStack_638._472_8_ = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar13 == &scandir_req) {
    auStack_638._472_8_ = SEXT48(scandir_req.fs_type);
    auStack_638._464_8_ = (uv__queue *)0x16;
    if ((uv__queue *)auStack_638._472_8_ != (uv__queue *)0x16) goto LAB_00196d90;
    auStack_638._472_8_ = scandir_req.result;
    auStack_638._464_8_ = (uv__queue *)0xffffffffffffffec;
    if (scandir_req.result != -0x14) goto LAB_00196d9f;
    if (scandir_req.ptr == (void *)0x0) {
      auStack_638._448_8_ = (uv__io_cb)0x196d80;
      iVar2 = uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    auStack_638._448_8_ = (uv__io_cb)0x196d90;
    file_scandir_cb_cold_1();
LAB_00196d90:
    auStack_638._448_8_ = (uv__io_cb)0x196d9f;
    file_scandir_cb_cold_2();
LAB_00196d9f:
    auStack_638._448_8_ = (uv__io_cb)0x196dae;
    file_scandir_cb_cold_3();
  }
  auStack_638._448_8_ = run_test_fs_scandir_early_exit;
  file_scandir_cb_cold_4();
  alStack_648[0] = 0;
  puStack_660 = (uv_fs_t *)0x196ddc;
  auStack_638._448_8_ = puVar5;
  iVar2 = uv_fs_scandir(0,auStack_638,"test/fixtures/one_file",0,0);
  lStack_658 = (long)iVar2;
  if (alStack_648[0] < lStack_658) {
    lStack_658 = -0xfff;
    puStack_660 = (uv_fs_t *)0x196e08;
    iVar2 = uv_fs_scandir_next(auStack_638,alStack_648);
    lStack_650 = (long)iVar2;
    if (lStack_658 == lStack_650) goto LAB_00196efd;
    puVar5 = (uv_loop_t *)auStack_638;
    puStack_660 = (uv_fs_t *)0x196e2b;
    uv_fs_req_cleanup(puVar5);
    lStack_658 = 0;
    puStack_660 = (uv_fs_t *)0x196e49;
    iVar2 = uv_fs_scandir(0,puVar5,"test/fixtures",0,0);
    lStack_650 = (long)iVar2;
    if (lStack_650 <= lStack_658) goto LAB_00196f0a;
    lStack_658 = -0xfff;
    puStack_660 = (uv_fs_t *)0x196e76;
    iVar2 = uv_fs_scandir_next(auStack_638,alStack_648);
    lStack_650 = (long)iVar2;
    if (lStack_658 == lStack_650) goto LAB_00196f17;
    puStack_660 = (uv_fs_t *)0x196e96;
    uv_fs_req_cleanup(auStack_638);
    puStack_660 = (uv_fs_t *)0x196e9b;
    puVar5 = (uv_loop_t *)uv_default_loop();
    puStack_660 = (uv_fs_t *)0x196eaf;
    uv_walk(puVar5,close_walk_cb,0);
    puStack_660 = (uv_fs_t *)0x196eb9;
    uv_run(puVar5,0);
    lStack_658 = 0;
    puStack_660 = (uv_fs_t *)0x196ec6;
    uVar6 = uv_default_loop();
    puStack_660 = (uv_fs_t *)0x196ece;
    iVar2 = uv_loop_close(uVar6);
    lStack_650 = (long)iVar2;
    if (lStack_658 == lStack_650) {
      puStack_660 = (uv_fs_t *)0x196ee5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_660 = (uv_fs_t *)0x196efd;
    run_test_fs_scandir_early_exit_cold_1();
LAB_00196efd:
    puStack_660 = (uv_fs_t *)0x196f0a;
    run_test_fs_scandir_early_exit_cold_5();
LAB_00196f0a:
    puStack_660 = (uv_fs_t *)0x196f17;
    run_test_fs_scandir_early_exit_cold_2();
LAB_00196f17:
    puStack_660 = (uv_fs_t *)0x196f24;
    run_test_fs_scandir_early_exit_cold_4();
  }
  puStack_660 = (uv_fs_t *)run_test_fs_open_dir;
  run_test_fs_scandir_early_exit_cold_3();
  puStack_668 = puVar5;
  puStack_660 = puVar17;
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&uStack_828,".",0,0,0);
  uStack_830 = (ulong)iVar2;
  if (uStack_830 == 0) {
    uStack_830 = uStack_828.result;
    if (uStack_828.result < 0) goto LAB_001970f5;
    if (uStack_828.ptr != (void *)0x0) goto LAB_00197104;
    puVar17 = &uStack_828;
    uv_fs_req_cleanup(puVar17);
    iVar2 = uv_fs_close(0,puVar17,uStack_828.result & 0xffffffff,0);
    uStack_830 = (ulong)iVar2;
    if (uStack_830 != 0) goto LAB_00197109;
    iVar2 = uv_fs_open(loop,&uStack_828,".",0,0,open_cb_simple);
    uStack_830 = (ulong)iVar2;
    if (uStack_830 != 0) goto LAB_00197118;
    uStack_830 = (ulong)open_cb_count;
    if (uStack_830 != 0) goto LAB_00197127;
    uv_run(loop,0);
    puVar5 = loop;
    uStack_830 = 1;
    if (open_cb_count != 1) goto LAB_00197136;
    uv_walk(loop,close_walk_cb,0);
    uv_run(puVar5,0);
    uStack_830 = 0;
    iVar2 = uv_loop_close(loop);
    if (uStack_830 == (long)iVar2) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_open_dir_cold_1();
LAB_001970f5:
    run_test_fs_open_dir_cold_8();
LAB_00197104:
    run_test_fs_open_dir_cold_2();
LAB_00197109:
    run_test_fs_open_dir_cold_3();
LAB_00197118:
    run_test_fs_open_dir_cold_4();
LAB_00197127:
    run_test_fs_open_dir_cold_5();
LAB_00197136:
    run_test_fs_open_dir_cold_6();
  }
  puVar14 = &uStack_830;
  run_test_fs_open_dir_cold_7();
  if ((int)puVar14[9] == 1) {
    puVar7 = (ulong *)puVar14[0xb];
    if ((long)puVar7 < 0) goto LAB_001971a4;
    open_cb_count = open_cb_count + 1;
    puVar7 = puVar14;
    if (puVar14[0xd] != 0) {
      iVar2 = uv_fs_req_cleanup();
      return iVar2;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar7 = extraout_RAX;
LAB_001971a4:
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar7;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar2);
  fs_file_open_append(iVar2);
  uVar6 = uv_default_loop();
  uv_walk(uVar6,close_walk_cb,0);
  uv_run(uVar6,0);
  uVar8 = uv_default_loop();
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_open_append_cold_1();
  pcVar12 = "test_file";
  puStack_8b0 = (uv_fs_t *)0x19723b;
  uStack_888 = uVar6;
  puStack_880 = puVar17;
  unlink("test_file");
  puStack_8b0 = (uv_fs_t *)0x197240;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_8b0 = (uv_fs_t *)0x197266;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  sVar1 = open_req1.result;
  sStack_890 = (ssize_t)iVar2;
  sStack_898 = 0;
  if (sStack_890 == 0) {
    sStack_890 = open_req1.result;
    sStack_898 = 0;
    pcVar12 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_001976fa;
    puStack_8b0 = (uv_fs_t *)0x1972b7;
    uv_fs_req_cleanup(&open_req1);
    puStack_8b0 = (uv_fs_t *)0x1972c8;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    puVar17 = (uv_fs_t *)0x0;
    uStack_8a8 = 0;
    puStack_8b0 = (uv_fs_t *)0x197301;
    iVar2 = uv_fs_write(0,&write_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    pcVar12 = (char *)sVar1;
    if (sStack_890 < 0) goto LAB_00197709;
    sStack_890 = write_req.result;
    sStack_898 = 0;
    if (write_req.result < 0) goto LAB_00197718;
    puStack_8b0 = (uv_fs_t *)0x19734e;
    uv_fs_req_cleanup(&write_req);
    puStack_8b0 = (uv_fs_t *)0x197360;
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 != 0) goto LAB_00197727;
    sStack_890 = close_req.result;
    sStack_898 = 0;
    if (close_req.result != 0) goto LAB_00197736;
    puStack_8b0 = (uv_fs_t *)0x1973b1;
    uv_fs_req_cleanup(&close_req);
    puStack_8b0 = (uv_fs_t *)0x1973d1;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    pcVar16 = (char *)open_req1.result;
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 < 0) goto LAB_00197745;
    sStack_890 = open_req1.result;
    sStack_898 = 0;
    if (open_req1.result < 0) goto LAB_00197754;
    puStack_8b0 = (uv_fs_t *)0x197422;
    uv_fs_req_cleanup(&open_req1);
    puStack_8b0 = (uv_fs_t *)0x197433;
    uVar22 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    puVar17 = (uv_fs_t *)0x0;
    uStack_8a8 = 0;
    puStack_8b0 = (uv_fs_t *)0x19746c;
    iov = uVar22;
    iVar2 = uv_fs_write(0,&write_req,(ulong)pcVar16 & 0xffffffff,&iov,1,0xffffffffffffffff);
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 < 0) goto LAB_00197763;
    sStack_890 = write_req.result;
    sStack_898 = 0;
    if (write_req.result < 0) goto LAB_00197772;
    puStack_8b0 = (uv_fs_t *)0x1974b9;
    uv_fs_req_cleanup(&write_req);
    puStack_8b0 = (uv_fs_t *)0x1974cb;
    iVar2 = uv_fs_close(0,&close_req,(ulong)pcVar16 & 0xffffffff,0);
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 != 0) goto LAB_00197781;
    sStack_890 = close_req.result;
    sStack_898 = 0;
    if (close_req.result != 0) goto LAB_00197790;
    puStack_8b0 = (uv_fs_t *)0x19751c;
    uv_fs_req_cleanup(&close_req);
    puStack_8b0 = (uv_fs_t *)0x19753c;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    pcVar12 = (char *)open_req1.result;
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 != 0) goto LAB_0019779f;
    sStack_890 = open_req1.result;
    sStack_898 = 0;
    if (open_req1.result < 0) goto LAB_001977ae;
    puStack_8b0 = (uv_fs_t *)0x19758d;
    uv_fs_req_cleanup(&open_req1);
    puStack_8b0 = (uv_fs_t *)0x19759e;
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_8a8 = 0;
    puStack_8b0 = (uv_fs_t *)0x1975d8;
    iov = uVar22;
    uVar3 = uv_fs_read(0,&read_req,(ulong)pcVar12 & 0xffffffff,&iov,1,0xffffffffffffffff);
    unaff_RBP = (ulong)uVar3;
    puStack_8b0 = (uv_fs_t *)0x1975ea;
    printf("read = %d\n",(ulong)uVar3);
    sStack_890 = 0x1a;
    sStack_898 = (ssize_t)(int)uVar3;
    if (sStack_898 != 0x1a) goto LAB_001977bd;
    sStack_890 = 0x1a;
    sStack_898 = read_req.result;
    if (read_req.result != 0x1a) goto LAB_001977cc;
    puStack_8b0 = (uv_fs_t *)0x197648;
    iVar2 = memcmp(buf,"test-buffer\n",0x1a);
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 != 0) goto LAB_001977db;
    puStack_8b0 = (uv_fs_t *)0x197674;
    uv_fs_req_cleanup(&read_req);
    puStack_8b0 = (uv_fs_t *)0x197686;
    iVar2 = uv_fs_close(0,&close_req,(ulong)pcVar12 & 0xffffffff,0);
    sStack_890 = (ssize_t)iVar2;
    sStack_898 = 0;
    if (sStack_890 != 0) goto LAB_001977ea;
    sStack_890 = close_req.result;
    sStack_898 = 0;
    if (close_req.result == 0) {
      puStack_8b0 = (uv_fs_t *)0x1976d7;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  else {
    puStack_8b0 = (uv_fs_t *)0x1976fa;
    fs_file_open_append_cold_1();
LAB_001976fa:
    puStack_8b0 = (uv_fs_t *)0x197709;
    fs_file_open_append_cold_19();
LAB_00197709:
    puStack_8b0 = (uv_fs_t *)0x197718;
    fs_file_open_append_cold_18();
LAB_00197718:
    puStack_8b0 = (uv_fs_t *)0x197727;
    fs_file_open_append_cold_17();
LAB_00197727:
    puStack_8b0 = (uv_fs_t *)0x197736;
    fs_file_open_append_cold_2();
LAB_00197736:
    puStack_8b0 = (uv_fs_t *)0x197745;
    fs_file_open_append_cold_3();
LAB_00197745:
    pcVar16 = pcVar12;
    puStack_8b0 = (uv_fs_t *)0x197754;
    fs_file_open_append_cold_16();
LAB_00197754:
    puStack_8b0 = (uv_fs_t *)0x197763;
    fs_file_open_append_cold_15();
LAB_00197763:
    puStack_8b0 = (uv_fs_t *)0x197772;
    fs_file_open_append_cold_14();
LAB_00197772:
    puStack_8b0 = (uv_fs_t *)0x197781;
    fs_file_open_append_cold_13();
LAB_00197781:
    puStack_8b0 = (uv_fs_t *)0x197790;
    fs_file_open_append_cold_4();
LAB_00197790:
    puStack_8b0 = (uv_fs_t *)0x19779f;
    fs_file_open_append_cold_5();
LAB_0019779f:
    pcVar12 = pcVar16;
    puStack_8b0 = (uv_fs_t *)0x1977ae;
    fs_file_open_append_cold_6();
LAB_001977ae:
    puStack_8b0 = (uv_fs_t *)0x1977bd;
    fs_file_open_append_cold_12();
LAB_001977bd:
    puStack_8b0 = (uv_fs_t *)0x1977cc;
    fs_file_open_append_cold_7();
LAB_001977cc:
    puStack_8b0 = (uv_fs_t *)0x1977db;
    fs_file_open_append_cold_8();
LAB_001977db:
    puStack_8b0 = (uv_fs_t *)0x1977ea;
    fs_file_open_append_cold_9();
LAB_001977ea:
    puStack_8b0 = (uv_fs_t *)0x1977f9;
    fs_file_open_append_cold_10();
  }
  puStack_8b0 = (uv_fs_t *)run_test_fs_rename_to_existing_file;
  fs_file_open_append_cold_11();
  pcStack_8b8 = pcVar12;
  puStack_8b0 = puVar17;
  unlink("test_file");
  unlink("test_file2");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  sVar1 = open_req1.result;
  lStack_8c0 = (long)iVar2;
  if (lStack_8c0 == 0) {
    lStack_8c0 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00197d17;
    uv_fs_req_cleanup(&open_req1);
    uVar22 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    puVar17 = (uv_fs_t *)0x0;
    iov = uVar22;
    iVar2 = uv_fs_write(0,&write_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 < 0) goto LAB_00197d26;
    lStack_8c0 = write_req.result;
    if (write_req.result < 0) goto LAB_00197d35;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197d44;
    lStack_8c0 = close_req.result;
    if (close_req.result != 0) goto LAB_00197d53;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    sVar1 = open_req1.result;
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197d62;
    lStack_8c0 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00197d71;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197d80;
    lStack_8c0 = close_req.result;
    if (close_req.result != 0) goto LAB_00197d8f;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197d9e;
    lStack_8c0 = rename_req.result;
    if (rename_req.result != 0) goto LAB_00197dad;
    uv_fs_req_cleanup(&rename_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    sVar1 = open_req1.result;
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197dbc;
    lStack_8c0 = open_req1.result;
    if (open_req1.result < 0) goto LAB_00197dcb;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar17 = (uv_fs_t *)0x0;
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 < 0) goto LAB_00197dda;
    lStack_8c0 = read_req.result;
    if (read_req.result < 0) goto LAB_00197de9;
    iVar2 = strcmp(buf,test_buf);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197df8;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    lStack_8c0 = (long)iVar2;
    if (lStack_8c0 != 0) goto LAB_00197e07;
    lStack_8c0 = close_req.result;
    if (close_req.result != 0) goto LAB_00197e16;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    puVar5 = loop;
    uv_walk(loop,close_walk_cb,0);
    uv_run(puVar5,0);
    lStack_8c0 = 0;
    iVar2 = uv_loop_close(loop);
    if (lStack_8c0 == iVar2) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00197d17:
    run_test_fs_rename_to_existing_file_cold_20();
LAB_00197d26:
    run_test_fs_rename_to_existing_file_cold_19();
LAB_00197d35:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00197d44:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00197d53:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00197d62:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00197d71:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00197d80:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00197d8f:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00197d9e:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00197dad:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00197dbc:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00197dcb:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00197dda:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00197de9:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00197df8:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00197e07:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00197e16:
    run_test_fs_rename_to_existing_file_cold_12();
  }
  iVar2 = (int)&lStack_8c0;
  run_test_fs_rename_to_existing_file_cold_13();
  fs_read_bufs(iVar2);
  fs_read_bufs(iVar2);
  uVar9 = uv_default_loop();
  uv_walk(uVar9,close_walk_cb,0);
  uv_run(uVar9,0);
  uVar6 = uv_default_loop();
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_read_bufs_cold_1();
  pcStack_c68 = (code *)0x197ed0;
  uStack_900 = uVar9;
  puStack_8f8 = puVar17;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  sVar1 = open_req1.result;
  apcStack_c00[0] = (char *)(long)iVar2;
  auStack_c40._0_8_ = (char *)0x0;
  if (apcStack_c00[0] == (char *)0x0) {
    apcStack_c00[0] = (char *)open_req1.result;
    auStack_c40._0_8_ = (char *)0x0;
    uVar9 = open_req1.result;
    if (open_req1.result < 0) goto LAB_0019822d;
    pcStack_c68 = (code *)0x197f21;
    uv_fs_req_cleanup(&open_req1);
    apcStack_c00[0] = (char *)0xffffffffffffffea;
    uStack_c60 = 0;
    pcStack_c68 = (code *)0x197f4a;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,0,0,0);
    auStack_c40._0_8_ = SEXT48(iVar2);
    uVar9 = sVar1;
    if (apcStack_c00[0] != (char *)auStack_c40._0_8_) goto LAB_0019823c;
    apcStack_c00[0] = (char *)0xffffffffffffffea;
    uStack_c60 = 0;
    pcStack_c68 = (code *)0x197f8d;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,0,1,0);
    auStack_c40._0_8_ = SEXT48(iVar2);
    if (apcStack_c00[0] != (char *)auStack_c40._0_8_) goto LAB_0019824b;
    apcStack_c00[0] = (char *)0xffffffffffffffea;
    uStack_c60 = 0;
    pcStack_c68 = (code *)0x197fd0;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,auStack_c40,0,0);
    pcStack_c50 = (char *)(long)iVar2;
    if (apcStack_c00[0] != pcStack_c50) goto LAB_0019825a;
    pcStack_c68 = (code *)0x197ff6;
    auStack_c40 = uv_buf_init(apcStack_c00,0x100);
    puVar17 = (uv_fs_t *)auStack_c40;
    pcStack_c68 = (code *)0x198014;
    auStack_c30 = uv_buf_init(auStack_b00,0x100);
    pcStack_c68 = (code *)0x19802e;
    auStack_c20 = uv_buf_init(auStack_a00,0x80);
    pcStack_c68 = (code *)0x198048;
    auStack_c10 = uv_buf_init(auStack_980,0x80);
    pcStack_c50 = (char *)0x1be;
    uStack_c60 = 0;
    pcStack_c68 = (code *)0x19807d;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,puVar17,2,0);
    pcStack_c48 = (char *)(long)iVar2;
    if (pcStack_c50 != pcStack_c48) goto LAB_00198269;
    pcStack_c50 = (char *)0x1be;
    pcStack_c48 = (char *)read_req.result;
    if (read_req.result != 0x1be) goto LAB_00198278;
    puVar17 = (uv_fs_t *)auStack_c20;
    unaff_R15 = &read_req;
    pcStack_c68 = (code *)0x1980cd;
    uv_fs_req_cleanup(&read_req);
    pcStack_c50 = (char *)0xbe;
    uStack_c60 = 0;
    pcStack_c68 = (code *)0x1980f9;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,puVar17,2,0x100);
    pcStack_c48 = (char *)(long)iVar2;
    if (pcStack_c50 != pcStack_c48) goto LAB_00198287;
    pcStack_c50 = (char *)read_req.result;
    pcStack_c48 = (char *)0xbe;
    if (read_req.result != 0xbe) goto LAB_00198296;
    pcStack_c68 = (code *)0x198141;
    uv_fs_req_cleanup(&read_req);
    puVar17 = (uv_fs_t *)auStack_c30._0_8_;
    pcStack_c68 = (code *)0x198158;
    iVar2 = memcmp((void *)auStack_c30._0_8_,(void *)auStack_c20._0_8_,0x80);
    pcStack_c50 = (char *)(long)iVar2;
    pcStack_c48 = (char *)0x0;
    if (pcStack_c50 != (char *)0x0) goto LAB_001982a5;
    puVar17 = (uv_fs_t *)&((uv_stat_t *)((long)puVar17 + 0x70))->st_nlink;
    pcStack_c68 = (code *)0x19818e;
    iVar2 = memcmp(puVar17,(void *)auStack_c10._0_8_,0x3e);
    pcStack_c50 = (char *)(long)iVar2;
    pcStack_c48 = (char *)0x0;
    if (pcStack_c50 != (char *)0x0) goto LAB_001982b4;
    pcStack_c68 = (code *)0x1981c0;
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    pcStack_c50 = (char *)(long)iVar2;
    pcStack_c48 = (char *)0x0;
    if (pcStack_c50 != (char *)0x0) goto LAB_001982c3;
    pcStack_c50 = (char *)close_req.result;
    pcStack_c48 = (char *)0x0;
    if (close_req.result == 0) {
      pcStack_c68 = (code *)0x198211;
      iVar2 = uv_fs_req_cleanup(&close_req);
      return iVar2;
    }
  }
  else {
    pcStack_c68 = (code *)0x19822d;
    fs_read_bufs_cold_1();
LAB_0019822d:
    pcStack_c68 = (code *)0x19823c;
    fs_read_bufs_cold_13();
LAB_0019823c:
    pcStack_c68 = (code *)0x19824b;
    fs_read_bufs_cold_2();
LAB_0019824b:
    pcStack_c68 = (code *)0x19825a;
    fs_read_bufs_cold_3();
LAB_0019825a:
    pcStack_c68 = (code *)0x198269;
    fs_read_bufs_cold_4();
LAB_00198269:
    pcStack_c68 = (code *)0x198278;
    fs_read_bufs_cold_5();
LAB_00198278:
    pcStack_c68 = (code *)0x198287;
    fs_read_bufs_cold_6();
LAB_00198287:
    pcStack_c68 = (code *)0x198296;
    fs_read_bufs_cold_7();
LAB_00198296:
    pcStack_c68 = (code *)0x1982a5;
    fs_read_bufs_cold_8();
LAB_001982a5:
    pcStack_c68 = (code *)0x1982b4;
    fs_read_bufs_cold_9();
LAB_001982b4:
    pcStack_c68 = (code *)0x1982c3;
    fs_read_bufs_cold_10();
LAB_001982c3:
    pcStack_c68 = (code *)0x1982d2;
    fs_read_bufs_cold_11();
  }
  iVar2 = (int)&pcStack_c50;
  pcStack_c68 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_12();
  puStack_c80 = (uv_fs_t *)0x1982eb;
  pcStack_c68 = (code *)uVar9;
  fs_read_file_eof(iVar2);
  puStack_c80 = (uv_fs_t *)0x1982f0;
  fs_read_file_eof(iVar2);
  puStack_c80 = (uv_fs_t *)0x1982f5;
  uVar9 = uv_default_loop();
  puStack_c80 = (uv_fs_t *)0x198309;
  uv_walk(uVar9,close_walk_cb,0);
  puStack_c80 = (uv_fs_t *)0x198313;
  uv_run(uVar9,0);
  uStack_c70 = 0;
  puStack_c80 = (uv_fs_t *)0x198321;
  uVar6 = uv_default_loop();
  puStack_c80 = (uv_fs_t *)0x198329;
  iVar2 = uv_loop_close(uVar6);
  uStack_c78 = (uint64_t)iVar2;
  if (uStack_c70 == uStack_c78) {
    puStack_c80 = (uv_fs_t *)0x19833f;
    uv_library_shutdown();
    return 0;
  }
  puStack_c80 = (uv_fs_t *)fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  uStack_c90 = uVar9;
  puStack_c88 = puVar17;
  puStack_c80 = unaff_R15;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  sVar1 = open_req1.result;
  pcStack_c98 = (char *)(long)iVar2;
  if (pcStack_c98 == (char *)0x0) {
    pcStack_c98 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_00198748;
    uv_fs_req_cleanup(&open_req1);
    uVar22 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    puVar17 = (uv_fs_t *)0x0;
    iov = uVar22;
    iVar2 = uv_fs_write(0,&write_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcStack_c98 = (char *)(long)iVar2;
    if ((long)pcStack_c98 < 0) goto LAB_00198757;
    pcStack_c98 = (char *)write_req.result;
    if (write_req.result < 0) goto LAB_00198766;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    pcStack_c98 = (char *)(long)iVar2;
    if (pcStack_c98 != (char *)0x0) goto LAB_00198775;
    pcStack_c98 = (char *)close_req.result;
    if (close_req.result != 0) goto LAB_00198784;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    sVar1 = open_req1.result;
    pcStack_c98 = (char *)(long)iVar2;
    if (pcStack_c98 != (char *)0x0) goto LAB_00198793;
    pcStack_c98 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_001987a2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar17 = (uv_fs_t *)0x0;
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    sVar1 = open_req1.result;
    pcStack_c98 = (char *)(long)iVar2;
    if ((long)pcStack_c98 < 0) goto LAB_001987b1;
    pcStack_c98 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_001987c0;
    iVar2 = strcmp(buf,test_buf);
    pcStack_c98 = (char *)(long)iVar2;
    if (pcStack_c98 != (char *)0x0) goto LAB_001987cf;
    puVar17 = &read_req;
    uv_fs_req_cleanup(&read_req);
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    unaff_R15 = (uv_fs_t *)0x0;
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,&iov,1,read_req.result);
    pcStack_c98 = (char *)(long)iVar2;
    if (pcStack_c98 != (char *)0x0) goto LAB_001987de;
    pcStack_c98 = (char *)read_req.result;
    if (read_req.result != 0) goto LAB_001987ed;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    pcStack_c98 = (char *)(long)iVar2;
    if (pcStack_c98 != (char *)0x0) goto LAB_001987fc;
    pcStack_c98 = (char *)close_req.result;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  else {
    fs_read_file_eof_cold_1();
LAB_00198748:
    fs_read_file_eof_cold_15();
LAB_00198757:
    fs_read_file_eof_cold_14();
LAB_00198766:
    fs_read_file_eof_cold_13();
LAB_00198775:
    fs_read_file_eof_cold_2();
LAB_00198784:
    fs_read_file_eof_cold_3();
LAB_00198793:
    fs_read_file_eof_cold_4();
LAB_001987a2:
    fs_read_file_eof_cold_12();
LAB_001987b1:
    fs_read_file_eof_cold_11();
LAB_001987c0:
    fs_read_file_eof_cold_10();
LAB_001987cf:
    fs_read_file_eof_cold_5();
LAB_001987de:
    fs_read_file_eof_cold_6();
LAB_001987ed:
    fs_read_file_eof_cold_7();
LAB_001987fc:
    fs_read_file_eof_cold_8();
  }
  iVar2 = (int)&pcStack_c98;
  fs_read_file_eof_cold_9();
  fs_write_multiple_bufs(iVar2);
  fs_write_multiple_bufs(iVar2);
  pvVar10 = (void *)uv_default_loop();
  uv_walk(pvVar10,close_walk_cb,0);
  uv_run(pvVar10,0);
  uVar6 = uv_default_loop();
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_multiple_bufs_cold_1();
  pvStack_ce8 = pvVar10;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  sVar1 = open_req1.result;
  auStack_d10._0_8_ = SEXT48(iVar2);
  asStack_d20[0] = 0;
  if ((void *)auStack_d10._0_8_ == (void *)0x0) {
    auStack_d10._0_8_ = open_req1.result;
    asStack_d20[0] = 0;
    if (open_req1.result < 0) goto LAB_00198f47;
    uv_fs_req_cleanup(&open_req1);
    auStack_d10 = uv_buf_init(test_buf,0xd);
    puVar17 = (uv_fs_t *)auStack_d10;
    auStack_d00._0_16_ = uv_buf_init(test_buf2,0xf);
    unaff_R15 = (uv_fs_t *)0x0;
    iVar2 = uv_fs_write(0,&write_req,sVar1 & 0xffffffff,puVar17,2,0);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] < 0) goto LAB_00198f56;
    asStack_d20[0] = write_req.result;
    asStack_d20[1] = 0;
    if (write_req.result < 0) goto LAB_00198f65;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00198f74;
    asStack_d20[0] = close_req.result;
    asStack_d20[1] = 0;
    if (close_req.result != 0) goto LAB_00198f83;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    sVar1 = open_req1.result;
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00198f92;
    asStack_d20[0] = open_req1.result;
    asStack_d20[1] = 0;
    if (open_req1.result < 0) goto LAB_00198fa1;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar23 = uv_buf_init(buf,0xd);
    auStack_d10 = auVar23;
    auVar23 = uv_buf_init(buf2);
    auStack_d00._0_16_ = auVar23;
    asStack_d20[0] = lseek64((int)sVar1,0,1);
    asStack_d20[1] = 0;
    puVar17 = (uv_fs_t *)buf2;
    if (asStack_d20[0] != 0) goto LAB_00198fb0;
    puVar17 = (uv_fs_t *)0x0;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,auStack_d10,2,0xffffffffffffffff);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] < 0) goto LAB_00198fbf;
    asStack_d20[0] = read_req.result;
    asStack_d20[1] = 0x1c;
    if (read_req.result != 0x1c) goto LAB_00198fce;
    iVar2 = strcmp(buf,test_buf);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00198fdd;
    iVar2 = strcmp(buf2,test_buf2);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00198fec;
    puVar17 = &read_req;
    uv_fs_req_cleanup(&read_req);
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    unaff_R15 = (uv_fs_t *)0x0;
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] != 0) goto LAB_00198ffb;
    asStack_d20[0] = read_req.result;
    asStack_d20[1] = 0;
    if (read_req.result != 0) goto LAB_0019900a;
    puVar17 = &read_req;
    uv_fs_req_cleanup(&read_req);
    auVar23 = uv_buf_init(buf,0xd);
    unaff_R15 = (uv_fs_t *)auStack_d10;
    auStack_d10 = auVar23;
    auVar23 = uv_buf_init(buf2,0xf);
    unaff_R12 = (char *)0x0;
    auStack_d00._0_16_ = auVar23;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,unaff_R15,2,0);
    asStack_d20[0] = (ssize_t)iVar2;
    asStack_d20[1] = 0;
    if (asStack_d20[0] < 0) goto LAB_00199019;
    lVar15 = read_req.result;
    if (read_req.result == 0xd) {
      puVar17 = (uv_fs_t *)auStack_d00;
      unaff_R15 = &read_req;
      uv_fs_req_cleanup(&read_req);
      unaff_R12 = (char *)0x0;
      iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,puVar17,1,read_req.result);
      asStack_d20[0] = (ssize_t)iVar2;
      asStack_d20[1] = 0;
      if (-1 < asStack_d20[0]) {
        asStack_d20[0] = read_req.result;
        asStack_d20[1] = 0xf;
        if (read_req.result != 0xf) {
          fs_write_multiple_bufs_cold_12();
          lVar15 = extraout_RAX_00;
          goto LAB_00198d98;
        }
        goto LAB_00198db6;
      }
      goto LAB_00199082;
    }
LAB_00198d98:
    unaff_R12 = (char *)0x0;
    asStack_d20[1] = 0x1c;
    asStack_d20[0] = lVar15;
    if (lVar15 == 0x1c) {
LAB_00198db6:
      unaff_R12 = (char *)0x0;
      iVar2 = strcmp(buf,test_buf);
      asStack_d20[0] = (ssize_t)iVar2;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_00199028;
      iVar2 = strcmp(buf2,test_buf2);
      asStack_d20[0] = (ssize_t)iVar2;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_00199037;
      puVar17 = &read_req;
      uv_fs_req_cleanup(&read_req);
      uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
      unaff_R15 = (uv_fs_t *)0x0;
      iov = uVar22;
      iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,&iov,1,0x1c);
      asStack_d20[0] = (ssize_t)iVar2;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_00199046;
      asStack_d20[0] = read_req.result;
      asStack_d20[1] = 0;
      if (read_req.result != 0) goto LAB_00199055;
      uv_fs_req_cleanup(&read_req);
      iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
      asStack_d20[0] = (ssize_t)iVar2;
      asStack_d20[1] = 0;
      if (asStack_d20[0] != 0) goto LAB_00199064;
      asStack_d20[0] = close_req.result;
      asStack_d20[1] = 0;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_00199073;
    }
  }
  else {
    fs_write_multiple_bufs_cold_1();
LAB_00198f47:
    fs_write_multiple_bufs_cold_25();
LAB_00198f56:
    fs_write_multiple_bufs_cold_24();
LAB_00198f65:
    fs_write_multiple_bufs_cold_23();
LAB_00198f74:
    fs_write_multiple_bufs_cold_2();
LAB_00198f83:
    fs_write_multiple_bufs_cold_3();
LAB_00198f92:
    fs_write_multiple_bufs_cold_4();
LAB_00198fa1:
    fs_write_multiple_bufs_cold_22();
LAB_00198fb0:
    fs_write_multiple_bufs_cold_5();
LAB_00198fbf:
    fs_write_multiple_bufs_cold_21();
LAB_00198fce:
    fs_write_multiple_bufs_cold_6();
LAB_00198fdd:
    fs_write_multiple_bufs_cold_7();
LAB_00198fec:
    fs_write_multiple_bufs_cold_8();
LAB_00198ffb:
    fs_write_multiple_bufs_cold_9();
LAB_0019900a:
    fs_write_multiple_bufs_cold_10();
LAB_00199019:
    fs_write_multiple_bufs_cold_20();
LAB_00199028:
    fs_write_multiple_bufs_cold_13();
LAB_00199037:
    fs_write_multiple_bufs_cold_14();
LAB_00199046:
    fs_write_multiple_bufs_cold_15();
LAB_00199055:
    fs_write_multiple_bufs_cold_16();
LAB_00199064:
    fs_write_multiple_bufs_cold_17();
LAB_00199073:
    fs_write_multiple_bufs_cold_18();
LAB_00199082:
    fs_write_multiple_bufs_cold_19();
  }
  iVar2 = (int)asStack_d20;
  fs_write_multiple_bufs_cold_11();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  pvVar10 = (void *)uv_default_loop();
  uv_walk(pvVar10,close_walk_cb,0);
  uv_run(pvVar10,0);
  uVar6 = uv_default_loop();
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  pcStack_d98 = (code *)0x19912c;
  pvStack_d70 = pvVar10;
  puStack_d68 = (uv_fs_t *)unaff_R12;
  unlink("test_file");
  pcStack_d98 = (code *)0x199131;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_d98 = (code *)0x199142;
  pvVar11 = malloc(0xd4310);
  if (pvVar11 == (void *)0x0) {
LAB_001995a2:
    pvVar11 = pvVar10;
    pcStack_d98 = (code *)0x1995a7;
    fs_write_alotof_bufs_cold_18();
LAB_001995a7:
    puVar13 = unaff_R15;
    pcStack_d98 = (code *)0x1995b6;
    fs_write_alotof_bufs_cold_1();
    puVar18 = puVar17;
LAB_001995b6:
    pcStack_d98 = (code *)0x1995c5;
    fs_write_alotof_bufs_cold_17();
LAB_001995c5:
    pcStack_d98 = (code *)0x1995d4;
    fs_write_alotof_bufs_cold_16();
LAB_001995d4:
    pcStack_d98 = (code *)0x1995e3;
    fs_write_alotof_bufs_cold_2();
LAB_001995e3:
    puVar17 = puVar18;
    pcStack_d98 = (code *)0x1995e8;
    fs_write_alotof_bufs_cold_15();
LAB_001995e8:
    pcStack_d98 = (code *)0x1995f7;
    fs_write_alotof_bufs_cold_3();
LAB_001995f7:
    pcStack_d98 = (code *)0x199606;
    fs_write_alotof_bufs_cold_4();
LAB_00199606:
    unaff_R15 = puVar13;
    pcStack_d98 = (code *)0x199615;
    fs_write_alotof_bufs_cold_5();
LAB_00199615:
    pcStack_d98 = (code *)0x199624;
    fs_write_alotof_bufs_cold_14();
LAB_00199624:
    pcStack_d98 = (code *)0x199633;
    fs_write_alotof_bufs_cold_13();
LAB_00199633:
    pcStack_d98 = (code *)0x199642;
    fs_write_alotof_bufs_cold_6();
LAB_00199642:
    pcStack_d98 = (code *)0x199651;
    fs_write_alotof_bufs_cold_8();
LAB_00199651:
    pcStack_d98 = (code *)0x199660;
    fs_write_alotof_bufs_cold_9();
LAB_00199660:
    pcStack_d98 = (code *)0x19966f;
    fs_write_alotof_bufs_cold_10();
LAB_0019966f:
    pcStack_d98 = (code *)0x19967e;
    fs_write_alotof_bufs_cold_11();
  }
  else {
    pcStack_d98 = (code *)0x199171;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    puVar13 = (uv_fs_t *)open_req1.result;
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    if (sStack_d78 != 0) goto LAB_001995a7;
    sStack_d78 = open_req1.result;
    sStack_d80 = 0;
    puVar18 = puVar17;
    if (open_req1.result < 0) goto LAB_001995b6;
    pcStack_d98 = (code *)0x1991c2;
    uv_fs_req_cleanup(&open_req1);
    lVar15 = 8;
    do {
      pcStack_d98 = (code *)0x1991dc;
      auVar23 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar11 + lVar15 + -8) = auVar23._0_8_;
      *(long *)((long)pvVar11 + lVar15) = auVar23._8_8_;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    puVar18 = (uv_fs_t *)0x0;
    uStack_d90 = 0;
    pcStack_d98 = (code *)0x19921a;
    iVar2 = uv_fs_write(0,&write_req,(ulong)puVar13 & 0xffffffff,pvVar11,0xd431,0xffffffffffffffff);
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    unaff_R12 = (char *)0xd4318;
    if (sStack_d78 < 0) goto LAB_001995c5;
    sStack_d78 = write_req.result;
    sStack_d80 = 0xac67d;
    if (write_req.result != 0xac67d) goto LAB_001995d4;
    pcStack_d98 = (code *)0x199267;
    uv_fs_req_cleanup(&write_req);
    pcStack_d98 = (code *)0x199271;
    puVar17 = (uv_fs_t *)malloc(0xac67d);
    if (puVar17 == (uv_fs_t *)0x0) goto LAB_001995e3;
    lVar15 = 8;
    unaff_R12 = (char *)puVar17;
    do {
      pcStack_d98 = (code *)0x199293;
      auVar23 = uv_buf_init(unaff_R12,0xd);
      *(long *)((long)pvVar11 + lVar15 + -8) = auVar23._0_8_;
      *(long *)((long)pvVar11 + lVar15) = auVar23._8_8_;
      lVar15 = lVar15 + 0x10;
      unaff_R12 = (char *)((long)&((uv_fs_t *)unaff_R12)->loop + 5);
    } while (lVar15 != 0xd4318);
    pcStack_d98 = (code *)0x1992c0;
    iVar2 = uv_fs_close(0,&close_req,(ulong)puVar13 & 0xffffffff,0);
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    unaff_R13 = 0xd4318;
    if (sStack_d78 != 0) goto LAB_001995e8;
    sStack_d78 = close_req.result;
    sStack_d80 = 0;
    if (close_req.result != 0) goto LAB_001995f7;
    pcStack_d98 = (code *)0x199311;
    uv_fs_req_cleanup(&close_req);
    pcStack_d98 = (code *)0x19932e;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    unaff_R15 = (uv_fs_t *)open_req1.result;
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    if (sStack_d78 != 0) goto LAB_00199606;
    sStack_d78 = open_req1.result;
    sStack_d80 = 0;
    if (open_req1.result < 0) goto LAB_00199615;
    pcStack_d98 = (code *)0x19937f;
    uv_fs_req_cleanup(&open_req1);
    unaff_R12 = (char *)0x0;
    uStack_d90 = 0;
    pcStack_d98 = (code *)0x1993a7;
    iVar2 = uv_fs_read(0,&read_req,(ulong)unaff_R15 & 0xffffffff,pvVar11,0xd431,0xffffffffffffffff);
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    if (sStack_d78 < 0) goto LAB_00199624;
    sStack_d78 = read_req.result;
    sStack_d80 = 0x3400;
    if (read_req.result != 0x3400) goto LAB_00199633;
    unaff_R13 = 0;
    unaff_R12 = test_buf;
    sVar1 = sStack_d78;
    do {
      sStack_d78 = sVar1;
      pcStack_d98 = (code *)0x199403;
      iVar2 = strncmp((char *)((long)puVar17->reserved + unaff_R13 + -0x18),test_buf,0xd);
      sStack_d78 = (ssize_t)iVar2;
      sStack_d80 = 0;
      if (sStack_d78 != 0) {
        pcStack_d98 = (code *)0x1995a2;
        fs_write_alotof_bufs_cold_7();
        pvVar10 = pvVar11;
        goto LAB_001995a2;
      }
      unaff_R13 = unaff_R13 + 0xd;
      sVar1 = 0;
    } while (unaff_R13 != 0x3400);
    pcStack_d98 = (code *)0x19943c;
    uv_fs_req_cleanup(&read_req);
    pcStack_d98 = (code *)0x199444;
    free(puVar17);
    pcStack_d98 = (code *)0x199455;
    sStack_d78 = lseek64((int)unaff_R15,write_req.result,0);
    sStack_d80 = write_req.result;
    if (sStack_d78 != write_req.result) goto LAB_00199642;
    pcStack_d98 = (code *)0x199487;
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar17 = (uv_fs_t *)0x0;
    uStack_d90 = 0;
    pcStack_d98 = (code *)0x1994c1;
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,(ulong)unaff_R15 & 0xffffffff,&iov,1,0xffffffffffffffff);
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    if (sStack_d78 != 0) goto LAB_00199651;
    sStack_d78 = read_req.result;
    sStack_d80 = 0;
    if (read_req.result != 0) goto LAB_00199660;
    pcStack_d98 = (code *)0x19950e;
    uv_fs_req_cleanup(&read_req);
    pcStack_d98 = (code *)0x199521;
    iVar2 = uv_fs_close(0,&close_req,(ulong)unaff_R15 & 0xffffffff,0);
    sStack_d78 = (ssize_t)iVar2;
    sStack_d80 = 0;
    if (sStack_d78 != 0) goto LAB_0019966f;
    sStack_d78 = close_req.result;
    sStack_d80 = 0;
    if (close_req.result == 0) {
      pcStack_d98 = (code *)0x199572;
      uv_fs_req_cleanup(&close_req);
      pcStack_d98 = (code *)0x19957e;
      unlink("test_file");
      free(pvVar11);
      return extraout_EAX;
    }
  }
  iVar2 = (int)&sStack_d78;
  pcStack_d98 = run_test_fs_write_alotof_bufs_with_offset;
  fs_write_alotof_bufs_cold_12();
  pcStack_db0 = (code *)0x199697;
  pcStack_d98 = (code *)pvVar11;
  fs_write_alotof_bufs_with_offset(iVar2);
  pcStack_db0 = (code *)0x19969c;
  fs_write_alotof_bufs_with_offset(iVar2);
  pcStack_db0 = (code *)0x1996a1;
  pvVar10 = (void *)uv_default_loop();
  pcStack_db0 = (code *)0x1996b5;
  uv_walk(pvVar10,close_walk_cb,0);
  pcStack_db0 = (code *)0x1996bf;
  uv_run(pvVar10,0);
  lStack_da0 = 0;
  pcStack_db0 = (code *)0x1996cd;
  uVar6 = uv_default_loop();
  pcStack_db0 = (code *)0x1996d5;
  iVar2 = uv_loop_close(uVar6);
  lStack_da8 = (long)iVar2;
  if (lStack_da0 == lStack_da8) {
    pcStack_db0 = (code *)0x1996eb;
    uv_library_shutdown();
    return 0;
  }
  pcStack_db0 = fs_write_alotof_bufs_with_offset;
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_e08 = (code *)0x19971a;
  pvStack_dd8 = pvVar10;
  puStack_dd0 = (uv_fs_t *)unaff_R12;
  lStack_dc8 = unaff_R13;
  puStack_dc0 = puVar17;
  puStack_db8 = unaff_R15;
  pcStack_db0 = (code *)unaff_RBP;
  unlink("test_file");
  pcStack_e08 = (code *)0x19971f;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_e08 = (code *)0x199730;
  pvVar11 = malloc(0xd4310);
  if (pvVar11 == (void *)0x0) {
LAB_00199bc9:
    pvVar11 = pvVar10;
    pcStack_e08 = (code *)0x199bce;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00199bce:
    pcStack_e08 = (code *)0x199bdd;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00199bdd:
    pcStack_e08 = (code *)0x199bec;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00199bec:
    pcStack_e08 = (code *)0x199bfb;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00199bfb:
    pcStack_e08 = (code *)0x199c0a;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00199c0a:
    pcStack_e08 = (code *)0x199c19;
    fs_write_alotof_bufs_with_offset_cold_15();
LAB_00199c19:
    pcStack_e08 = (code *)0x199c28;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00199c28:
    pcStack_e08 = (code *)0x199c2d;
    fs_write_alotof_bufs_with_offset_cold_14();
LAB_00199c2d:
    pcStack_e08 = (code *)0x199c3c;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00199c3c:
    pcStack_e08 = (code *)0x199c4b;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00199c4b:
    pcStack_e08 = (code *)0x199c5a;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00199c5a:
    pcStack_e08 = (code *)0x199c69;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00199c69:
    pcStack_e08 = (code *)0x199c78;
    fs_write_alotof_bufs_with_offset_cold_9();
LAB_00199c78:
    pcStack_e08 = (code *)0x199c87;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00199c87:
    pcStack_e08 = (code *)0x199c96;
    fs_write_alotof_bufs_with_offset_cold_11();
  }
  else {
    pcStack_e08 = (code *)0x19975f;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    sVar1 = open_req1.result;
    lStack_df0 = (long)iVar2;
    lStack_df8 = 0;
    if (lStack_df0 != 0) goto LAB_00199bce;
    lStack_df0 = open_req1.result;
    lStack_df8 = 0;
    if (open_req1.result < 0) goto LAB_00199bdd;
    pcStack_e08 = (code *)0x1997b0;
    uv_fs_req_cleanup(&open_req1);
    pcStack_e08 = (code *)0x1997c1;
    uVar22 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_e00 = 0;
    pcStack_e08 = (code *)0x1997fc;
    iov = uVar22;
    iVar2 = uv_fs_write(0,&write_req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff);
    lVar15 = (long)iVar2;
    lStack_df8 = 10;
    lStack_df0 = lVar15;
    if (lVar15 != 10) goto LAB_00199bec;
    lStack_df0 = write_req.result;
    lStack_df8 = 10;
    if (write_req.result != 10) goto LAB_00199bfb;
    pcStack_e08 = (code *)0x19984e;
    uv_fs_req_cleanup(&write_req);
    lVar19 = 8;
    do {
      pcStack_e08 = (code *)0x199868;
      auVar23 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar11 + lVar19 + -8) = auVar23._0_8_;
      *(long *)((long)pvVar11 + lVar19) = auVar23._8_8_;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0xd4318);
    uStack_e00 = 0;
    pcStack_e08 = (code *)0x1998a2;
    iVar2 = uv_fs_write(0,&write_req,sVar1 & 0xffffffff,pvVar11,0xd431,10);
    lStack_df0 = (long)iVar2;
    lStack_df8 = 0;
    if (lStack_df0 < 0) goto LAB_00199c0a;
    lStack_df0 = write_req.result;
    lStack_df8 = 0xac67d;
    if (write_req.result != 0xac67d) goto LAB_00199c19;
    pcStack_e08 = (code *)0x1998ef;
    uv_fs_req_cleanup(&write_req);
    pcStack_e08 = (code *)0x1998f9;
    pcVar12 = (char *)malloc(0xac67d);
    if (pcVar12 == (char *)0x0) goto LAB_00199c28;
    lVar19 = 8;
    pcVar16 = pcVar12;
    do {
      pcStack_e08 = (code *)0x19991b;
      auVar23 = uv_buf_init(pcVar16,0xd);
      *(long *)((long)pvVar11 + lVar19 + -8) = auVar23._0_8_;
      *(long *)((long)pvVar11 + lVar19) = auVar23._8_8_;
      lVar19 = lVar19 + 0x10;
      pcVar16 = pcVar16 + 0xd;
    } while (lVar19 != 0xd4318);
    uStack_e00 = 0;
    pcStack_e08 = (code *)0x19995e;
    lStack_de8 = lVar15;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,pvVar11,0xd431,10);
    lStack_df0 = (long)iVar2;
    lStack_df8 = 0;
    if (lStack_df0 < 0) goto LAB_00199c2d;
    uStack_de0 = sVar1;
    lStack_df0 = read_req.result;
    lStack_df8 = 0xd;
    if (iVar2 != 0xd) {
      lStack_df8 = 0x3400;
    }
    if (read_req.result != lStack_df8) goto LAB_00199c3c;
    pcVar16 = pcVar12;
    uVar20 = 0;
    lVar15 = lStack_df0;
    do {
      lStack_df0 = lVar15;
      pcStack_e08 = (code *)0x1999d0;
      iVar4 = strncmp(pcVar16,test_buf,0xd);
      lStack_df0 = (long)iVar4;
      lStack_df8 = 0;
      if (lStack_df0 != 0) {
        pcStack_e08 = (code *)0x199bc9;
        fs_write_alotof_bufs_with_offset_cold_6();
        pvVar10 = pvVar11;
        goto LAB_00199bc9;
      }
      if (iVar2 == 0xd) break;
      pcVar16 = pcVar16 + 0xd;
      bVar21 = uVar20 < 0x3ff;
      uVar20 = uVar20 + 1;
      lVar15 = 0;
    } while (bVar21);
    pcStack_e08 = (code *)0x199a15;
    uv_fs_req_cleanup(&read_req);
    pcStack_e08 = (code *)0x199a1d;
    free(pcVar12);
    pcStack_e08 = (code *)0x199a34;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    uVar20 = uStack_de0;
    lVar15 = lStack_de8;
    lStack_df0 = (long)iVar2;
    lStack_df8 = 0;
    if (lStack_df0 != 0) goto LAB_00199c4b;
    lStack_df0 = *(long *)((long)stat_req.ptr + 0x38);
    lStack_df8 = write_req.result + lStack_de8;
    if (lStack_df0 != lStack_df8) goto LAB_00199c5a;
    pcStack_e08 = (code *)0x199a99;
    uv_fs_req_cleanup(&stat_req);
    pcStack_e08 = (code *)0x199aaa;
    uVar22 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_e00 = 0;
    pcStack_e08 = (code *)0x199ae7;
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,uVar20 & 0xffffffff,&iov,1,lVar15 + write_req.result);
    lStack_df0 = (long)iVar2;
    lStack_df8 = 0;
    if (lStack_df0 != 0) goto LAB_00199c69;
    lStack_df0 = read_req.result;
    lStack_df8 = 0;
    if (read_req.result != 0) goto LAB_00199c78;
    pcStack_e08 = (code *)0x199b34;
    uv_fs_req_cleanup(&read_req);
    pcStack_e08 = (code *)0x199b47;
    iVar2 = uv_fs_close(0,&close_req,uVar20 & 0xffffffff,0);
    lStack_df0 = (long)iVar2;
    lStack_df8 = 0;
    if (lStack_df0 != 0) goto LAB_00199c87;
    lStack_df0 = close_req.result;
    lStack_df8 = 0;
    if (close_req.result == 0) {
      pcStack_e08 = (code *)0x199b98;
      uv_fs_req_cleanup(&close_req);
      pcStack_e08 = (code *)0x199ba4;
      unlink("test_file");
      free(pvVar11);
      return extraout_EAX_00;
    }
  }
  pcStack_e08 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_12();
  pcStack_e08 = (code *)pvVar11;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00199ed4;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    sVar1 = open_req1.result;
    if (iVar2 != 0) goto LAB_00199ee3;
    if (open_req1.result < 0) goto LAB_00199ef2;
    uv_fs_req_cleanup(&open_req1);
    uVar22 = (uv_buf_t)uv_buf_init(auStack_e0a,2);
    iov = uVar22;
    iVar2 = uv_fs_read(0,&read_req,sVar1 & 0xffffffff,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_00199f01;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,sVar1 & 0xffffffff,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar5 = loop;
      uv_walk(loop,close_walk_cb,0);
      uv_run(puVar5,0);
      iVar2 = uv_loop_close(loop);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00199f1f;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00199ed4:
    run_test_fs_read_dir_cold_2();
LAB_00199ee3:
    run_test_fs_read_dir_cold_3();
LAB_00199ef2:
    run_test_fs_read_dir_cold_7();
LAB_00199f01:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00199f1f:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  ASSERT_NULL(req.ptr);
  ASSERT_EQ(UV_EOF, uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT_OK(r);

  ASSERT_OK(scandir_cb_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, scandir_cb_count);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}